

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O1

uint32_t wasm::Bits::getMaskedBits(uint32_t mask)

{
  int iVar1;
  
  if (mask == 0xffffffff) {
    return 0x20;
  }
  if (mask == 0) {
    return 0;
  }
  if ((mask + 1 & mask) != 0) {
    return 0;
  }
  iVar1 = countLeadingZeroes(mask);
  return 0x20 - iVar1;
}

Assistant:

inline uint32_t getMaskedBits(uint32_t mask) {
  if (mask == uint32_t(-1)) {
    return 32; // all the bits
  }
  if (mask == 0) {
    return 0; // trivially not a mask
  }
  // otherwise, see if x & (x + 1) turns this into non-zero value
  // 00011111 & (00011111 + 1) => 0
  if (mask & (mask + 1)) {
    return 0;
  }
  // this is indeed a mask
  return 32 - countLeadingZeroes(mask);
}